

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

void __thiscall boost::thread::~thread(thread *this)

{
  detach(this);
  detail::shared_count::~shared_count(&(this->thread_info).pn);
  return;
}

Assistant:

~thread()
        {

    #if defined BOOST_THREAD_PROVIDES_THREAD_DESTRUCTOR_CALLS_TERMINATE_IF_JOINABLE
          if (joinable()) {
            std::terminate();
          }
    #else
            detach();
    #endif
        }